

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsplitter.cpp
# Opt level: O1

void __thiscall QSplitterPrivate::recalc(QSplitterPrivate *this,bool update)

{
  undefined1 *puVar1;
  Orientation OVar2;
  QWidget *this_00;
  QSplitterLayoutStruct *pQVar3;
  ulong uVar4;
  int iVar5;
  Representation RVar6;
  ulong uVar7;
  undefined8 uVar8;
  QSize QVar9;
  QSize QVar10;
  long lVar11;
  Representation RVar12;
  int iVar13;
  byte bVar14;
  int iVar15;
  ulong uVar16;
  uint uVar17;
  uint uVar18;
  int iVar19;
  bool bVar20;
  int local_54;
  
  this_00 = *(QWidget **)&(this->super_QFramePrivate).super_QWidgetPrivate.field_0x8;
  uVar17 = (uint)(this->list).d.size;
  bVar20 = uVar17 != 0;
  if (0 < (int)uVar17) {
    bVar14 = 1;
    uVar16 = 0;
    do {
      pQVar3 = (this->list).d.ptr[uVar16];
      uVar18 = pQVar3->widget->data->widget_attributes;
      if (((uVar18 >> 0x10 & 1) == 0) && (bVar20 != false)) {
        bVar20 = (bool)(bVar20 & -(pQVar3->field_0x14 & 1));
      }
      uVar18 = uVar18 >> 0x10 & 1;
      QWidget::setHidden(&pQVar3->handle->super_QWidget,(bool)((byte)uVar18 | bVar14));
      if (uVar18 == 0) {
        bVar14 = 0;
      }
      uVar16 = uVar16 + 1;
    } while ((uVar17 & 0x7fffffff) != uVar16);
  }
  if ((0 < (int)uVar17) && (bVar20 != false)) {
    uVar16 = 0;
    do {
      pQVar3 = (this->list).d.ptr[uVar16];
      if ((pQVar3->widget->data->widget_attributes & 0x10000) == 0) {
        puVar1 = &pQVar3->field_0x14;
        *puVar1 = *puVar1 & 0xfe;
        break;
      }
      uVar16 = uVar16 + 1;
    } while ((uVar17 & 0x7fffffff) != uVar16);
  }
  iVar5 = QFrame::frameWidth((QFrame *)this_00);
  iVar5 = iVar5 * 2;
  iVar19 = iVar5;
  local_54 = iVar5;
  if ((int)uVar17 < 1) {
    bVar20 = true;
    iVar15 = 0xffffff;
  }
  else {
    iVar15 = 0xffffff;
    bVar20 = true;
    uVar16 = 0;
    do {
      pQVar3 = (this->list).d.ptr[uVar16];
      if ((pQVar3->widget->data->widget_attributes & 0x10000) == 0) {
        if ((((pQVar3->handle->super_QWidget).data)->widget_attributes & 0x10000) == 0) {
          OVar2 = this->orient;
          uVar7 = (**(code **)(*(long *)&pQVar3->handle->super_QWidget + 0x70))();
          uVar4 = uVar7 >> 0x20;
          if (OVar2 == Horizontal) {
            uVar4 = uVar7;
          }
          iVar19 = iVar19 + (int)uVar4;
          OVar2 = this->orient;
          uVar8 = (**(code **)(*(long *)&pQVar3->handle->super_QWidget + 0x70))();
          iVar13 = (int)((ulong)uVar8 >> 0x20);
          if (OVar2 == Horizontal) {
            iVar13 = (int)uVar8;
          }
          local_54 = local_54 + iVar13;
        }
        QVar9 = qSmartMinSize(pQVar3->widget);
        RVar6 = QVar9.ht.m_i;
        if (this->orient == Horizontal) {
          RVar6 = QVar9.wd.m_i;
        }
        iVar19 = iVar19 + RVar6.m_i;
        bVar20 = false;
        QVar10 = qSmartMaxSize(pQVar3->widget,(Alignment)0x0);
        RVar6 = QVar10.ht.m_i;
        if (this->orient == Horizontal) {
          RVar6 = QVar10.wd.m_i;
        }
        local_54 = RVar6.m_i + local_54;
        QVar10 = (QSize)((ulong)QVar9 >> 0x20);
        if (this->orient == Vertical) {
          QVar10 = QVar9;
        }
        RVar6.m_i = QVar10.wd.m_i.m_i;
        if (QVar10.wd.m_i.m_i < iVar5) {
          RVar6.m_i = iVar5;
        }
        iVar5 = RVar6.m_i;
        QVar10 = qSmartMaxSize(pQVar3->widget,(Alignment)0x0);
        QVar9 = (QSize)((ulong)QVar10 >> 0x20);
        if (this->orient == Vertical) {
          QVar9 = QVar10;
        }
        RVar12 = QVar9.wd.m_i;
        RVar6.m_i = RVar12.m_i;
        if (iVar15 < RVar12.m_i) {
          RVar6.m_i = iVar15;
        }
        if (0 < RVar12.m_i) {
          iVar15 = RVar6.m_i;
        }
      }
      uVar16 = uVar16 + 1;
    } while ((uVar17 & 0x7fffffff) != uVar16);
  }
  if (bVar20) {
    lVar11 = QMetaObject::cast((QObject *)&QSplitter::staticMetaObject);
    if (lVar11 != 0) {
      iVar15 = 0;
    }
    iVar13 = 0xffffff;
    if (lVar11 != 0) {
      iVar13 = 0;
    }
  }
  else {
    iVar13 = 0xffffff;
    if (local_54 < 0xffffff) {
      iVar13 = local_54;
    }
  }
  if (iVar15 <= iVar5) {
    iVar15 = iVar5;
  }
  if (update) {
    if (this->orient == Horizontal) {
      QWidget::setMaximumSize(this_00,iVar13,iVar15);
      bVar14 = (byte)(this_00->data->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
                     super_QFlagsStorage<Qt::WindowType>.i;
      iVar15 = iVar19;
    }
    else {
      QWidget::setMaximumSize(this_00,iVar15,iVar13);
      bVar14 = (byte)(this_00->data->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
                     super_QFlagsStorage<Qt::WindowType>.i;
      iVar15 = iVar5;
      iVar5 = iVar19;
    }
    if ((bVar14 & 1) != 0) {
      QWidget::setMinimumSize(this_00,iVar15,iVar5);
    }
    doResize(this);
    QWidget::updateGeometry(this_00);
    return;
  }
  this->field_0x2a5 = 1;
  return;
}

Assistant:

void QSplitterPrivate::recalc(bool update)
{
    Q_Q(QSplitter);
    int n = list.size();
    /*
      Splitter handles before the first visible widget or right
      before a hidden widget must be hidden.
    */
    bool first = true;
    bool allInvisible = n != 0;
    for (int i = 0; i < n ; ++i) {
        QSplitterLayoutStruct *s = list.at(i);
        bool widgetHidden = s->widget->isHidden();
        if (allInvisible && !widgetHidden && !s->collapsed)
            allInvisible = false;
        s->handle->setHidden(first || widgetHidden);
        if (!widgetHidden)
            first = false;
    }

    if (allInvisible)
        for (int i = 0; i < n ; ++i) {
            QSplitterLayoutStruct *s = list.at(i);
            if (!s->widget->isHidden()) {
                s->collapsed = false;
                break;
            }
        }

    int fi = 2 * q->frameWidth();
    int maxl = fi;
    int minl = fi;
    int maxt = QWIDGETSIZE_MAX;
    int mint = fi;
    /*
      calculate min/max sizes for the whole splitter
    */
    bool empty = true;
    for (int j = 0; j < n; j++) {
        QSplitterLayoutStruct *s = list.at(j);

        if (!s->widget->isHidden()) {
            empty = false;
            if (!s->handle->isHidden()) {
                minl += s->getHandleSize(orient);
                maxl += s->getHandleSize(orient);
            }

            QSize minS = qSmartMinSize(s->widget);
            minl += pick(minS);
            maxl += pick(qSmartMaxSize(s->widget));
            mint = qMax(mint, trans(minS));
            int tm = trans(qSmartMaxSize(s->widget));
            if (tm > 0)
                maxt = qMin(maxt, tm);
        }
    }

    if (empty) {
        if (qobject_cast<QSplitter *>(parent)) {
            // nested splitters; be nice
            maxl = maxt = 0;
        } else {
            // QSplitter with no children yet
            maxl = QWIDGETSIZE_MAX;
        }
    } else {
        maxl = qMin<int>(maxl, QWIDGETSIZE_MAX);
    }
    if (maxt < mint)
        maxt = mint;

    if (update) {
        if (orient == Qt::Horizontal) {
            q->setMaximumSize(maxl, maxt);
            if (q->isWindow())
                q->setMinimumSize(minl,mint);
        } else {
            q->setMaximumSize(maxt, maxl);
            if (q->isWindow())
                q->setMinimumSize(mint,minl);
        }
        doResize();
        q->updateGeometry();
    } else {
        firstShow = true;
    }
}